

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RevoluteJoint.cpp
# Opt level: O1

void __thiscall
iDynTree::RevoluteJoint::computeChildPosVelAcc
          (RevoluteJoint *this,VectorDynSize *jntPos,VectorDynSize *jntVel,VectorDynSize *jntAcc,
          LinkPositions *linkPositions,LinkVelArray *linkVels,LinkAccArray *linkAccs,LinkIndex child
          ,LinkIndex parent)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Transform *pTVar2;
  Twist *pTVar3;
  SpatialAcc *this_00;
  double dVar4;
  double dVar5;
  SpatialMotionVector vj;
  SpatialMotionVector S;
  Twist local_210 [48];
  SpatialAcc local_1e0;
  SpatialAcc local_1b0;
  SpatialMotionVector local_180;
  Transform local_150 [96];
  Twist local_f0 [48];
  Twist local_c0 [48];
  SpatialMotionVector local_90;
  SpatialAcc local_60;
  
  iVar1 = (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x18])();
  dVar4 = (double)iDynTree::VectorDynSize::operator()(jntVel,CONCAT44(extraout_var,iVar1));
  iVar1 = (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x18])(this);
  dVar5 = (double)iDynTree::VectorDynSize::operator()(jntAcc,CONCAT44(extraout_var_00,iVar1));
  iVar1 = (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[10])(this,jntPos,child,parent)
  ;
  (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[10])(this,jntPos,parent,child);
  pTVar2 = LinkPositions::operator()(linkPositions,parent);
  iDynTree::Transform::operator*(local_150,pTVar2);
  pTVar2 = LinkPositions::operator()(linkPositions,child);
  iDynTree::Transform::operator=(pTVar2,local_150);
  (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0xc])
            (local_150,this,0,child,LINK_INVALID_INDEX);
  iDynTree::SpatialMotionVector::operator*(&local_180,dVar4);
  LinkVelArray::operator()(linkVels,parent);
  iDynTree::Transform::operator*((Transform *)&local_1e0,(Twist *)CONCAT44(extraout_var_01,iVar1));
  iDynTree::Twist::Twist(local_210,&local_180);
  iDynTree::Twist::operator+((Twist *)&local_1b0,(Twist *)&local_1e0);
  pTVar3 = LinkVelArray::operator()(linkVels,child);
  iDynTree::Twist::operator=(pTVar3,(Twist *)&local_1b0);
  LinkAccArray::operator()(linkAccs,parent);
  iDynTree::Transform::operator*
            ((Transform *)local_210,(SpatialAcc *)CONCAT44(extraout_var_01,iVar1));
  iDynTree::SpatialMotionVector::operator*(&local_90,dVar5);
  iDynTree::SpatialAcc::SpatialAcc(&local_60,&local_90);
  iDynTree::SpatialAcc::operator+(&local_1e0,(SpatialAcc *)local_210);
  pTVar3 = LinkVelArray::operator()(linkVels,child);
  iDynTree::Twist::Twist(local_f0,&local_180);
  iDynTree::Twist::operator*(local_c0,pTVar3);
  iDynTree::SpatialAcc::operator+(&local_1b0,&local_1e0);
  this_00 = LinkAccArray::operator()(linkAccs,child);
  iDynTree::SpatialAcc::operator=(this_00,&local_1b0);
  return;
}

Assistant:

void RevoluteJoint::computeChildPosVelAcc(const VectorDynSize & jntPos,
                                          const VectorDynSize & jntVel,
                                          const VectorDynSize & jntAcc,
                                          LinkPositions & linkPositions,
                                          LinkVelArray & linkVels,
                                          LinkAccArray & linkAccs,
                                          const LinkIndex child,
                                          const LinkIndex parent) const
{
    double dang = jntVel(this->getDOFsOffset());
    double d2ang = jntAcc(this->getDOFsOffset());

    const Transform & child_X_parent = this->getTransform(jntPos,child,parent);
    const Transform & parent_X_child = this->getTransform(jntPos,parent,child);

    // Propagate position : position of the frame is expressed as
    // transform between the link frame and a reference frame :
    // ref_H_child  = ref_H_parent*parent_H_child
    linkPositions(child) = linkPositions(parent)*parent_X_child;

    // Propagate twist and spatial acceleration: for a revolute joint (as for any 1 dof joint)
    // we implement equation 5.14 and 5.15 of Feathestone RBDA, 2008
    iDynTree::SpatialMotionVector S = this->getMotionSubspaceVector(0,child);

    SpatialMotionVector vj = S*dang;
    linkVels(child) = child_X_parent*linkVels(parent) + vj;
    linkAccs(child) = child_X_parent*linkAccs(parent) + S*d2ang + linkVels(child)*vj;

    return;
}